

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void JX9StreamData_Close(void *pHandle)

{
  jx9_vm *pVm;
  jx9_stream_data *pData;
  void *pHandle_local;
  
  if (pHandle != (void *)0x0) {
    SyMemBackendFree(*pHandle,pHandle);
  }
  return;
}

Assistant:

static void JX9StreamData_Close(void *pHandle)
{
	jx9_stream_data *pData = (jx9_stream_data *)pHandle;
	jx9_vm *pVm;
	if( pData == 0 ){
		return;
	}
	pVm = pData->pVm;
	/* Free the instance */
	SyMemBackendFree(&pVm->sAllocator, pData);
}